

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8.cc
# Opt level: O1

int pkcs12_pbe_encrypt_init
              (CBB *out,EVP_CIPHER_CTX *ctx,int alg_nid,EVP_CIPHER *alg_cipher,uint32_t iterations,
              char *pass,size_t pass_len,uint8_t *salt,size_t salt_len)

{
  int iVar1;
  int iVar2;
  long lVar3;
  pbe_suite *suite;
  int iVar4;
  CBB param;
  CBB algorithm;
  
  if (alg_nid == -1) {
    iVar2 = PKCS5_pbe2_encrypt_init(out,ctx,alg_cipher,iterations,pass,pass_len,salt,salt_len);
  }
  else {
    suite = (pbe_suite *)0x0;
    lVar3 = 0;
    do {
      if (((*(int *)(kBuiltinPBE[0].oid + lVar3 + -4) == alg_nid) &&
          (*(long *)(kBuiltinPBE[0].oid + lVar3 + 0xc) != 0)) &&
         (*(long *)(kBuiltinPBE[0].oid + lVar3 + 0x14) != 0)) {
        suite = (pbe_suite *)(kBuiltinPBE[0].oid + lVar3 + -4);
        break;
      }
      lVar3 = lVar3 + 0x28;
    } while (lVar3 != 0xa0);
    if (suite == (pbe_suite *)0x0) {
      iVar2 = 0;
      ERR_put_error(0x13,0,0x77,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                    ,300);
    }
    else {
      iVar1 = CBB_add_asn1(out,&algorithm,0x20000010);
      iVar4 = 0;
      iVar2 = 0;
      if ((((iVar1 != 0) &&
           (iVar1 = CBB_add_asn1_element(&algorithm,6,suite->oid,(ulong)suite->oid_len),
           iVar2 = iVar4, iVar1 != 0)) &&
          ((iVar1 = CBB_add_asn1(&algorithm,&param,0x20000010), iVar1 != 0 &&
           ((iVar1 = CBB_add_asn1_octet_string(&param,salt,salt_len), iVar1 != 0 &&
            (iVar1 = CBB_add_asn1_uint64(&param,(ulong)iterations), iVar1 != 0)))))) &&
         (iVar1 = CBB_flush(out), iVar1 != 0)) {
        iVar2 = pkcs12_pbe_cipher_init(suite,ctx,iterations,pass,pass_len,salt,salt_len,1);
      }
    }
  }
  return iVar2;
}

Assistant:

int pkcs12_pbe_encrypt_init(CBB *out, EVP_CIPHER_CTX *ctx, int alg_nid,
                            const EVP_CIPHER *alg_cipher, uint32_t iterations,
                            const char *pass, size_t pass_len,
                            const uint8_t *salt, size_t salt_len) {
  // TODO(davidben): OpenSSL has since extended |pbe_nid| to control either
  // the PBES1 scheme or the PBES2 PRF. E.g. passing |NID_hmacWithSHA256| will
  // select PBES2 with HMAC-SHA256 as the PRF. Implement this if anything uses
  // it. See 5693a30813a031d3921a016a870420e7eb93ec90 in OpenSSL.
  if (alg_nid == -1) {
    return PKCS5_pbe2_encrypt_init(out, ctx, alg_cipher, iterations, pass,
                                   pass_len, salt, salt_len);
  }

  const struct pbe_suite *suite = get_pkcs12_pbe_suite(alg_nid);
  if (suite == NULL) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_UNKNOWN_ALGORITHM);
    return 0;
  }

  // See RFC 2898, appendix A.3.
  CBB algorithm, param;
  if (!CBB_add_asn1(out, &algorithm, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_element(&algorithm, CBS_ASN1_OBJECT, suite->oid,
                            suite->oid_len) ||
      !CBB_add_asn1(&algorithm, &param, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_octet_string(&param, salt, salt_len) ||
      !CBB_add_asn1_uint64(&param, iterations) || !CBB_flush(out)) {
    return 0;
  }

  return pkcs12_pbe_cipher_init(suite, ctx, iterations, pass, pass_len, salt,
                                salt_len, 1 /* encrypt */);
}